

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::RedefineVariable<mp::LinearFunctionalConstraint>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,int res_var,LinearFunctionalConstraint *fc)

{
  ConInfo *pCVar1;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>
  *pck;
  FunctionalConstraint *in_RDX;
  int in_ESI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  NodeRange NVar2;
  ConInfo ci;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>
  *ck;
  int i;
  ConInfo ci_old;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffed0;
  NodeIndexRange in_stack_fffffffffffffed8;
  ValueNode *in_stack_fffffffffffffee0;
  LinearFunctionalConstraint *in_stack_fffffffffffffef8;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffff00;
  undefined1 local_e8 [176];
  NodeIndexRange local_38;
  int local_2c;
  BasicConstraintKeeper *local_28;
  _Bit_type *local_20;
  FunctionalConstraint *local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  pCVar1 = GetInitExpression(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  local_28 = pCVar1->pck_;
  local_20 = *(_Bit_type **)&pCVar1->index_;
  FunctionalConstraint::SetResultVar(local_18,local_c);
  local_2c = MapFind<mp::LinearFunctionalConstraint>
                       (in_stack_fffffffffffffed0,
                        (LinearFunctionalConstraint *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  NVar2.ir_ = in_stack_fffffffffffffed8;
  NVar2.pvn_ = in_stack_fffffffffffffee0;
  if (local_2c < 0) {
    in_stack_fffffffffffffed0 =
         (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          *)local_e8;
    LinearFunctionalConstraint::LinearFunctionalConstraint
              ((LinearFunctionalConstraint *)in_stack_fffffffffffffed0,
               (LinearFunctionalConstraint *)
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    NVar2 = AddConstraint<mp::LinearFunctionalConstraint>
                      (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    unique0x10000200 = NVar2;
    in_stack_fffffffffffffecc = pre::NodeRange::operator_cast_to_int((NodeRange *)0x29c1f2);
    local_2c = in_stack_fffffffffffffecc;
    LinearFunctionalConstraint::~LinearFunctionalConstraint
              ((LinearFunctionalConstraint *)in_stack_fffffffffffffed0);
  }
  pck = GetConstraintKeeper(in_RDI,(LinearFunctionalConstraint *)0x0);
  ConstraintLocationHelper<mp::BasicConstraintKeeper>::ConstraintLocationHelper
            ((ConstraintLocationHelper<mp::BasicConstraintKeeper> *)&stack0xfffffffffffffef0,
             &pck->super_BasicConstraintKeeper,local_2c);
  ReplaceInitExpression
            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)NVar2.pvn_,NVar2.ir_.end_,(ConInfo *)in_stack_fffffffffffffed0);
  MarkAsBridged(in_stack_fffffffffffffed0,
                (ConInfo *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  return;
}

Assistant:

void RedefineVariable(int res_var, FuncConstraint&& fc) {
    assert( MPD( HasInitExpression(res_var) ) );
		auto ci_old = MPD( GetInitExpression(res_var) );
    fc.SetResultVar(res_var);
		// If this expression exists, use it.
		// TODO make sure any new context is re-converted
		// if necessary.
		auto i = MPD( MapFind(fc) );
    // TODO preprocess, try map again, and use the result.
		if (i<0)
      i = int( MPD( AddConstraint(std::move(fc)) ) );
		auto& ck = GET_CONSTRAINT_KEEPER( FuncConstraint );
    ConInfo ci{&ck, i};
    ReplaceInitExpression(res_var, ci);
    MarkAsBridged(ci_old);
  }